

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O1

spectral_operation __thiscall kitty::detail::spectrum::permutation(spectrum *this,uint i,uint j)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  
  piVar2 = (this->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar3 = (long)(this->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar3 != 0) {
    uVar4 = 0;
    do {
      uVar5 = (uint)uVar4;
      if ((uVar5 & j) == 0 && (uVar5 & i) != 0) {
        uVar5 = (j - i) + uVar5;
        iVar1 = piVar2[uVar4];
        piVar2[uVar4] = piVar2[uVar5];
        piVar2[uVar5] = iVar1;
      }
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) < (ulong)(lVar3 >> 2));
  }
  return (spectral_operation)(((uint6)j << 0x20) + (uint6)(i << 0x10) + 1);
}

Assistant:

auto permutation( unsigned i, unsigned j )
  {
    spectral_operation op( spectral_operation::kind::permutation, i, j );

    for ( auto k = 0u; k < _s.size(); ++k )
    {
      if ( ( k & i ) > 0 && ( k & j ) == 0 )
      {
        std::swap( _s[k], _s[k - i + j] );
      }
    }

    return op;
  }